

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_CDict *
ZSTD_initStaticCDict
          (void *workspace,size_t workspaceSize,void *dict,size_t dictSize,
          ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
          ZSTD_compressionParameters cParams)

{
  uint uVar1;
  size_t sVar2;
  size_t local_68;
  long local_58;
  void *ptr;
  ZSTD_CDict *cdict;
  size_t neededSize;
  size_t matchStateSize;
  ZSTD_dictContentType_e dictContentType_local;
  ZSTD_dictLoadMethod_e dictLoadMethod_local;
  size_t dictSize_local;
  void *dict_local;
  size_t workspaceSize_local;
  void *workspace_local;
  
  sVar2 = ZSTD_sizeof_matchState(&cParams,0);
  local_68 = dictSize;
  if (dictLoadMethod == ZSTD_dlm_byRef) {
    local_68 = 0;
  }
  if (((ulong)workspace & 7) == 0) {
    if (workspaceSize < local_68 + 0x2b08 + sVar2) {
      workspace_local = (void *)0x0;
    }
    else {
      if (dictLoadMethod == ZSTD_dlm_byCopy) {
        memcpy((void *)((long)workspace + 0x1308),dict,dictSize);
        dictSize_local = (long)workspace + 0x1308;
        local_58 = (long)workspace + dictSize + 0x1308;
      }
      else {
        local_58 = (long)workspace + 0x1308;
        dictSize_local = (size_t)dict;
      }
      *(long *)((long)workspace + 0x18) = local_58;
      *(size_t *)((long)workspace + 0x20) = sVar2 + 0x1800;
      sVar2 = ZSTD_initCDict_internal
                        ((ZSTD_CDict *)workspace,(void *)dictSize_local,dictSize,ZSTD_dlm_byRef,
                         dictContentType,cParams);
      uVar1 = ERR_isError(sVar2);
      workspace_local = workspace;
      if (uVar1 != 0) {
        workspace_local = (void *)0x0;
      }
    }
  }
  else {
    workspace_local = (void *)0x0;
  }
  return (ZSTD_CDict *)workspace_local;
}

Assistant:

const ZSTD_CDict* ZSTD_initStaticCDict(
                                 void* workspace, size_t workspaceSize,
                           const void* dict, size_t dictSize,
                                 ZSTD_dictLoadMethod_e dictLoadMethod,
                                 ZSTD_dictContentType_e dictContentType,
                                 ZSTD_compressionParameters cParams)
{
    size_t const matchStateSize = ZSTD_sizeof_matchState(&cParams, /* forCCtx */ 0);
    size_t const neededSize = sizeof(ZSTD_CDict) + (dictLoadMethod == ZSTD_dlm_byRef ? 0 : dictSize)
                            + HUF_WORKSPACE_SIZE + matchStateSize;
    ZSTD_CDict* const cdict = (ZSTD_CDict*) workspace;
    void* ptr;
    if ((size_t)workspace & 7) return NULL;  /* 8-aligned */
    DEBUGLOG(4, "(workspaceSize < neededSize) : (%u < %u) => %u",
        (unsigned)workspaceSize, (unsigned)neededSize, (unsigned)(workspaceSize < neededSize));
    if (workspaceSize < neededSize) return NULL;

    if (dictLoadMethod == ZSTD_dlm_byCopy) {
        memcpy(cdict+1, dict, dictSize);
        dict = cdict+1;
        ptr = (char*)workspace + sizeof(ZSTD_CDict) + dictSize;
    } else {
        ptr = cdict+1;
    }
    cdict->workspace = ptr;
    cdict->workspaceSize = HUF_WORKSPACE_SIZE + matchStateSize;

    if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                              dict, dictSize,
                                              ZSTD_dlm_byRef, dictContentType,
                                              cParams) ))
        return NULL;

    return cdict;
}